

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_manipulate.c
# Opt level: O1

int light_ip_flow(light_pcapng *sectionp,light_pcapng **flows,size_t *flow_count,size_t *dropped)

{
  _flow_information **pp_Var1;
  uint32_t *puVar2;
  undefined8 uVar3;
  bool bVar4;
  uint32_t uVar5;
  light_boolean lVar6;
  int iVar7;
  flow_information_t *__ptr;
  _light_pcapng *p_Var8;
  flow_information_t *pfVar9;
  light_pcapng *pp_Var10;
  light_option option;
  byte bVar11;
  flow_information_t *to_be_deleted;
  long lVar12;
  ulong uVar13;
  light_pcapng p_Var14;
  long lVar15;
  _light_pcapng *pcapng;
  uint uVar16;
  _flow_information *p_Var17;
  uint uVar18;
  undefined1 auVar19 [16];
  uint8_t protocol_version;
  uint8_t local_a9;
  void *local_a8;
  light_pcapng local_a0;
  light_pcapng **local_98;
  flow_information_t *local_90;
  size_t *local_88;
  light_pcapng local_80;
  size_t local_78;
  light_pcapng *local_70;
  address_t local_68;
  long local_58;
  long lStack_50;
  size_t *local_48;
  double local_40;
  ulong local_38;
  
  p_Var14 = *sectionp;
  local_70 = sectionp;
  uVar5 = light_get_block_count(p_Var14);
  lVar6 = __is_section_header(p_Var14);
  if (lVar6 == LIGHT_FALSE) {
    light_ip_flow_cold_1();
    iVar7 = -1;
  }
  else {
    local_38 = (ulong)uVar5;
    pcapng = p_Var14->next_block;
    *flow_count = 0;
    local_40 = (double)local_38;
    local_80 = (light_pcapng)0x0;
    local_a8 = (void *)0x0;
    uVar16 = 0;
    __ptr = (flow_information_t *)0x0;
    local_90 = (flow_information_t *)0x0;
    local_78 = 0;
    lVar12 = 0;
    local_a0 = p_Var14;
    local_98 = flows;
    local_88 = flow_count;
    local_48 = dropped;
    do {
      if (pcapng == (_light_pcapng *)0x0) {
        pcapng = (_light_pcapng *)0x0;
        break;
      }
      uVar5 = pcapng->block_type;
      if (uVar5 == 1) {
        uVar18 = uVar16 + 1;
        local_a8 = realloc(local_a8,(ulong)uVar18 * 8);
        *(_light_pcapng **)((long)local_a8 + (ulong)uVar16 * 8) = pcapng;
        local_80 = pcapng;
LAB_001039cd:
        lVar12 = lVar12 + 1;
        if (((ulong)(lVar12 * -0x2d77318fc504816f) >> 4 | lVar12 * -0x2d77318fc504816f << 0x3c) <
            0x68db8bac710cc) {
          auVar19._8_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar19._0_8_ = lVar12;
          auVar19._12_4_ = 0x45300000;
          printf("Flow extraction progress: %.2lf [%zu / %zu]\n",
                 SUB84((((auVar19._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) / local_40)
                       * 100.0,0),lVar12,local_38);
        }
        pcapng = pcapng->next_block;
        bVar4 = true;
        uVar16 = uVar18;
      }
      else {
        if (uVar5 != 0xa0d0d0a) {
          uVar18 = uVar16;
          if ((uVar5 != 6) && (uVar5 != 3)) goto LAB_001039cd;
          local_58 = 0;
          lStack_50 = 0;
          local_68._0_8_ = 0;
          local_68._8_8_ = 0;
          if (pcapng->block_type == 6) {
            lVar15 = 0x14;
LAB_00103878:
            lVar6 = __get_ip_address((uint8_t *)(lVar15 + (long)pcapng->block_body),
                                     (flow_address_t *)&local_68,&local_a9);
            if (lVar6 != LIGHT_FALSE) {
              pfVar9 = __ptr;
              if (__ptr == (flow_information_t *)0x0) {
                p_Var14 = local_80;
                if (uVar5 != 3) {
                  p_Var14 = *(light_pcapng *)((long)local_a8 + (ulong)*pcapng->block_body * 8);
                }
                __ptr = __create_flow(local_a0,p_Var14,(flow_address_t *)&local_68,local_a9);
                *local_88 = 1;
                pfVar9 = __ptr;
                local_90 = __ptr;
              }
              else {
                do {
                  if ((pfVar9->version == local_a9) &&
                     (((((lVar15 = *(long *)&(pfVar9->address).source, lVar15 == local_68._0_8_ &&
                         (*(long *)((long)&(pfVar9->address).source + 8) == local_68._8_8_)) &&
                        (*(long *)&(pfVar9->address).destination == local_58)) &&
                       (*(long *)((long)&(pfVar9->address).destination + 8) == lStack_50)) ||
                      (((lVar15 == local_58 &&
                        (*(long *)((long)&(pfVar9->address).source + 8) == lStack_50)) &&
                       ((*(long *)&(pfVar9->address).destination == local_68._0_8_ &&
                        (*(long *)((long)&(pfVar9->address).destination + 8) == local_68._8_8_))))))
                     )) goto LAB_00103955;
                  pp_Var1 = &pfVar9->next;
                  pfVar9 = *pp_Var1;
                } while (*pp_Var1 != (_flow_information *)0x0);
                pfVar9 = (flow_information_t *)0x0;
              }
LAB_00103955:
              if (pfVar9 == (flow_information_t *)0x0) {
                p_Var14 = local_80;
                if (uVar5 != 3) {
                  p_Var14 = *(light_pcapng *)((long)local_a8 + (ulong)*pcapng->block_body * 8);
                }
                pfVar9 = __create_flow(local_a0,p_Var14,(flow_address_t *)&local_68,local_a9);
                local_90->next = pfVar9;
                *local_88 = *local_88 + 1;
                flows = local_98;
                local_90 = pfVar9;
              }
              else {
                p_Var8 = __copy_block(pcapng,LIGHT_FALSE);
                pfVar9->last_block->next_block = p_Var8;
                pfVar9->last_block = p_Var8;
                flows = local_98;
              }
              goto LAB_001039cd;
            }
          }
          else if (pcapng->block_type == 3) {
            lVar15 = 4;
            goto LAB_00103878;
          }
          local_78 = local_78 + 1;
          goto LAB_001039cd;
        }
        *local_70 = pcapng;
        bVar4 = false;
      }
    } while (bVar4);
    if (local_48 != (size_t *)0x0) {
      *local_48 = local_78;
    }
    if (pcapng == (_light_pcapng *)0x0) {
      *local_70 = (light_pcapng)0x0;
    }
    pp_Var10 = (light_pcapng *)calloc(*local_88,8);
    *flows = pp_Var10;
    if (__ptr != (flow_information_t *)0x0) {
      uVar13 = 0;
      p_Var17 = __ptr;
      do {
        (*flows)[uVar13] = p_Var17->section;
        __validate_section((*flows)[uVar13]);
        p_Var14 = p_Var17->section;
        bVar11 = (p_Var17->version == '\x06') * ' ' + 1;
        if (p_Var17->version == '\x04') {
          bVar11 = 9;
        }
        option = light_alloc_option((ushort)bVar11);
        option->custom_option_code = 0xadd4;
        puVar2 = option->data;
        *(uint8_t *)puVar2 = p_Var17->version;
        if (p_Var17->version == '\x06') {
          uVar3 = *(undefined8 *)((long)&(p_Var17->address).source + 8);
          *(undefined8 *)((long)puVar2 + 1) = *(undefined8 *)&(p_Var17->address).source;
          *(undefined8 *)((long)puVar2 + 9) = uVar3;
          uVar3 = *(undefined8 *)((long)&(p_Var17->address).destination + 8);
          *(undefined8 *)((long)puVar2 + 0x11) = *(undefined8 *)&(p_Var17->address).destination;
          *(undefined8 *)((long)puVar2 + 0x19) = uVar3;
        }
        else if (p_Var17->version == '\x04') {
          *(anon_union_4_2_095bb53e_for_ipv4 *)((long)puVar2 + 1) = (p_Var17->address).source.ipv4;
          *(anon_union_4_2_095bb53e_for_ipv4 *)((long)puVar2 + 5) =
               (p_Var17->address).destination.ipv4;
        }
        light_add_option(p_Var14,p_Var17->section,option,LIGHT_FALSE);
        uVar13 = (ulong)((int)uVar13 + 1);
        p_Var17 = p_Var17->next;
      } while (p_Var17 != (_flow_information *)0x0);
      do {
        p_Var17 = __ptr->next;
        free(__ptr);
        __ptr = p_Var17;
      } while (p_Var17 != (_flow_information *)0x0);
    }
    free(local_a8);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int light_ip_flow(light_pcapng *sectionp, light_pcapng **flows, size_t *flow_count, size_t *dropped)
{
	light_pcapng section = *sectionp;
	size_t progress = 0;
	size_t limit = light_get_block_count(*sectionp);
	size_t skipped = 0;

	if (__is_section_header(section) == 0) {
		PCAPNG_ERROR("Invalid section header");
		return LIGHT_INVALID_SECTION;
	}

	light_pcapng current_section = section;
	light_pcapng current_interface = NULL;
	light_pcapng *interface_list = NULL;
	uint32_t interface_list_size = 0;

	flow_information_t *current_flow = NULL;
	flow_information_t *last_flow = NULL;
	light_pcapng current_block = section->next_block;

	*flow_count = 0;

	while (current_block != NULL) {
		uint32_t type = current_block->block_type;
		if (type == LIGHT_SECTION_HEADER_BLOCK) {
			// current_section = current_block;
			*sectionp = current_block;
			break;
		}
		else if (type == LIGHT_INTERFACE_BLOCK) {
			current_interface = current_block;
			interface_list = realloc(interface_list, (interface_list_size + 1) * sizeof(light_pcapng));
			interface_list[interface_list_size] = current_interface;
			interface_list_size++;
		}
		else if (type == LIGHT_ENHANCED_PACKET_BLOCK || type == LIGHT_SIMPLE_PACKET_BLOCK) {
			flow_address_t flow_key = {0};
			uint8_t protocol_version;
			flow_information_t *match = NULL;

			if (__get_address(current_block, &flow_key, &protocol_version) == LIGHT_FALSE) {
				skipped++;
				goto iterate;
			}

			if (current_flow == NULL) { // Beginning of the trace.
				if (type == LIGHT_SIMPLE_PACKET_BLOCK) {
					current_flow = __create_flow(current_section, current_interface, &flow_key, protocol_version);
				}
				else {
					struct _light_enhanced_packet_block *epb = (struct _light_enhanced_packet_block *)current_block->block_body;
					current_flow = __create_flow(current_section, interface_list[epb->interface_id], &flow_key, protocol_version);
				}
				match = current_flow;
				last_flow = current_flow;
				*flow_count = 1;
			}
			else {
				match = __find_flow(current_flow, &flow_key, protocol_version);
			}

			if (match == NULL) {
				if (type == LIGHT_SIMPLE_PACKET_BLOCK) {
					match = __create_flow(current_section, current_interface, &flow_key, protocol_version);
				}
				else {
					struct _light_enhanced_packet_block *epb = (struct _light_enhanced_packet_block *)current_block->block_body;
					match = __create_flow(current_section, interface_list[epb->interface_id], &flow_key, protocol_version);
				}

				last_flow->next = match;
				last_flow = match;
				*flow_count += 1;
			}
			else {
				match->last_block->next_block = __copy_block(current_block, LIGHT_FALSE);
				match->last_block = match->last_block->next_block;
			}
		}
		else {
			// TODO: Append other blocks to all flows accordingly.
		}

iterate:
		progress++;
		if (progress % 10000 == 0) {
			printf("Flow extraction progress: %.2lf [%zu / %zu]\n", (double)progress / limit * 100.0, progress, limit);
		}
		current_block = current_block->next_block;
	}

	if (dropped != NULL) {
		*dropped = skipped;
	}

	// End of trace.
	if (current_block == NULL) {
		*sectionp = NULL;
	}

	*flows = calloc(*flow_count, sizeof(light_pcapng));
	uint32_t index = 0;
	flow_information_t *iterator = current_flow;

	while (iterator != NULL) {
		(*flows)[index] = iterator->section;
		__validate_section((*flows)[index]);
		__append_address_information(iterator->section, iterator);
		index++;
		iterator = iterator->next;
	}

	while (current_flow != NULL) {
		flow_information_t *to_be_deleted = current_flow;
		current_flow = current_flow->next;
		free(to_be_deleted);
	}

	free(interface_list);

	return LIGHT_SUCCESS;
}